

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O0

void __thiscall
btMultiBodyPoint2Point::createConstraintRows
          (btMultiBodyPoint2Point *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  undefined4 uVar1;
  btMultiBody *this_00;
  int iVar2;
  btScalar *pbVar3;
  btVector3 *in_RCX;
  long in_RDX;
  btMultiBodyConstraint *in_RDI;
  btVector3 bVar4;
  btScalar posError;
  btVector3 pivotBworld;
  btVector3 pivotAworld;
  btVector3 contactNormalOnB;
  btMultiBodySolverConstraint *constraintRow;
  int i;
  int numDim;
  btScalar in_stack_000002ac;
  btScalar in_stack_000002b0;
  undefined1 in_stack_000002b7;
  btScalar in_stack_000002b8;
  btScalar in_stack_000002bc;
  btScalar in_stack_000002c0;
  btScalar in_stack_000002c4;
  btVector3 *in_stack_000002c8;
  btScalar *in_stack_000002d0;
  btScalar *in_stack_000002d8;
  btMultiBodyJacobianData *in_stack_000002e0;
  btMultiBodySolverConstraint *in_stack_000002e8;
  btMultiBodyConstraint *in_stack_000002f0;
  btVector3 *in_stack_00000300;
  btVector3 *in_stack_00000308;
  btContactSolverInfo *in_stack_00000310;
  btVector3 *in_stack_fffffffffffffec8;
  btTransform *in_stack_fffffffffffffed0;
  btVector3 *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  btScalar local_114;
  btVector3 local_108;
  btScalar local_f8;
  undefined8 local_f4;
  btScalar local_ec;
  btScalar in_stack_ffffffffffffff18;
  btScalar in_stack_ffffffffffffff1c;
  btScalar in_stack_ffffffffffffff24;
  btScalar in_stack_ffffffffffffff28;
  btScalar in_stack_ffffffffffffff2c;
  btMultiBody *local_c4;
  btScalar local_bc [2];
  btMultiBody *local_b4;
  btScalar local_ac [2];
  btMultiBody *local_a4;
  btScalar local_9c [2];
  btScalar local_94;
  btScalar local_90;
  btScalar local_8c;
  btVector3 local_88;
  btScalar local_78;
  btScalar local_74;
  btScalar local_70;
  btScalar local_6c;
  btScalar local_68;
  btScalar local_64;
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btMultiBodySolverConstraint *local_30;
  int local_28;
  int local_24;
  btVector3 *local_20;
  long local_18;
  
  local_24 = 3;
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    local_30 = btAlignedObjectArray<btMultiBodySolverConstraint>::expandNonInitializing
                         ((btAlignedObjectArray<btMultiBodySolverConstraint> *)
                          in_stack_fffffffffffffed0);
    local_30->m_orgConstraint = in_RDI;
    local_30->m_orgDofIndex = local_28;
    local_34 = 0.0;
    local_38 = 0.0;
    local_3c = 0.0;
    btVector3::setValue(&local_30->m_relpos1CrossNormal,&local_34,&local_38,&local_3c);
    local_40 = 0.0;
    local_44 = 0.0;
    local_48 = 0.0;
    btVector3::setValue(&local_30->m_contactNormal1,&local_40,&local_44,&local_48);
    local_4c = 0.0;
    local_50 = 0.0;
    local_54 = 0.0;
    btVector3::setValue(&local_30->m_relpos2CrossNormal,&local_4c,&local_50,&local_54);
    local_58 = 0.0;
    local_5c = 0.0;
    local_60 = 0.0;
    btVector3::setValue(&local_30->m_contactNormal2,&local_58,&local_5c,&local_60);
    local_64 = 0.0;
    local_68 = 0.0;
    local_6c = 0.0;
    btVector3::setValue(&local_30->m_angularComponentA,&local_64,&local_68,&local_6c);
    local_70 = 0.0;
    local_74 = 0.0;
    local_78 = 0.0;
    btVector3::setValue(&local_30->m_angularComponentB,&local_70,&local_74,&local_78);
    local_30->m_solverBodyIdA = *(int *)(local_18 + 200);
    local_30->m_solverBodyIdB = *(int *)(local_18 + 200);
    local_8c = 0.0;
    local_90 = 0.0;
    local_94 = 0.0;
    btVector3::btVector3(&local_88,&local_8c,&local_90,&local_94);
    pbVar3 = btVector3::operator_cast_to_float_(&local_88);
    pbVar3[local_28] = -1.0;
    local_a4 = in_RDI[1].m_bodyB;
    local_9c[0] = (btScalar)in_RDI[1].m_linkA;
    local_9c[1] = (btScalar)in_RDI[1].m_linkB;
    if (in_RDI[1]._vptr_btMultiBodyConstraint == (_func_int **)0x0) {
      if (in_RDI->m_bodyA != (btMultiBody *)0x0) {
        bVar4 = btMultiBody::localPosToWorld
                          ((btMultiBody *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           (int)in_stack_ffffffffffffff24,
                           (btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        local_c4 = bVar4.m_floats._0_8_;
        local_a4 = local_c4;
        local_bc = bVar4.m_floats._8_8_;
        local_9c[0] = local_bc[0];
        local_9c[1] = local_bc[1];
      }
    }
    else {
      iVar2 = btCollisionObject::getCompanionId
                        ((btCollisionObject *)in_RDI[1]._vptr_btMultiBodyConstraint);
      local_30->m_solverBodyIdA = iVar2;
      btRigidBody::getCenterOfMassTransform((btRigidBody *)in_RDI[1]._vptr_btMultiBodyConstraint);
      bVar4 = btTransform::operator*(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      local_b4 = bVar4.m_floats._0_8_;
      local_a4 = local_b4;
      local_ac = bVar4.m_floats._8_8_;
      local_9c[0] = local_ac[0];
      local_9c[1] = local_ac[1];
    }
    uVar1 = in_RDI[1].m_numRows;
    if (in_RDI[1].m_bodyA == (btMultiBody *)0x0) {
      in_stack_ffffffffffffff2c = (btScalar)uVar1;
      if (in_RDI->m_bodyB != (btMultiBody *)0x0) {
        this_00 = (btMultiBody *)CONCAT44(uVar1,in_stack_ffffffffffffff28);
        bVar4 = btMultiBody::localPosToWorld
                          (this_00,(int)in_stack_ffffffffffffff24,
                           (btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        local_f4 = bVar4.m_floats._0_8_;
        local_ec = bVar4.m_floats[2];
        in_stack_ffffffffffffff18 = bVar4.m_floats[3];
        in_stack_ffffffffffffff2c = bVar4.m_floats[0];
      }
    }
    else {
      iVar2 = btCollisionObject::getCompanionId((btCollisionObject *)in_RDI[1].m_bodyA);
      local_30->m_solverBodyIdB = iVar2;
      btRigidBody::getCenterOfMassTransform((btRigidBody *)in_RDI[1].m_bodyA);
      bVar4 = btTransform::operator*(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      in_stack_ffffffffffffff1c = bVar4.m_floats[0];
      in_stack_ffffffffffffff24 = bVar4.m_floats[2];
      in_stack_ffffffffffffff28 = bVar4.m_floats[3];
      in_stack_ffffffffffffff2c = in_stack_ffffffffffffff1c;
    }
    if (local_28 < 3) {
      local_108 = operator-((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffed8);
      local_114 = btVector3::dot(&local_108,&local_88);
    }
    else {
      local_114 = 0.0;
    }
    local_f8 = local_114;
    in_stack_fffffffffffffec8 = (btVector3 *)&local_a4;
    in_stack_fffffffffffffed0 = (btTransform *)&stack0xffffffffffffff2c;
    in_stack_fffffffffffffee0 = 0;
    in_stack_fffffffffffffed8 = local_20;
    btMultiBodyConstraint::fillMultiBodyConstraint
              (in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,
               in_stack_000002d0,in_stack_000002c8,in_stack_00000300,in_stack_00000308,
               in_stack_000002c4,in_stack_00000310,in_stack_000002c0,in_stack_000002bc,
               in_stack_000002b8,(bool)in_stack_000002b7,in_stack_000002b0,in_stack_000002ac);
  }
  return;
}

Assistant:

void btMultiBodyPoint2Point::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{

//	int i=1;
int numDim = BTMBP2PCONSTRAINT_DIM;
	for (int i=0;i<numDim;i++)
	{

		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();
        //memset(&constraintRow,0xffffffff,sizeof(btMultiBodySolverConstraint));
	constraintRow.m_orgConstraint = this;
	constraintRow.m_orgDofIndex = i;
        constraintRow.m_relpos1CrossNormal.setValue(0,0,0);
        constraintRow.m_contactNormal1.setValue(0,0,0);
        constraintRow.m_relpos2CrossNormal.setValue(0,0,0);
        constraintRow.m_contactNormal2.setValue(0,0,0);
        constraintRow.m_angularComponentA.setValue(0,0,0);
        constraintRow.m_angularComponentB.setValue(0,0,0);

		constraintRow.m_solverBodyIdA = data.m_fixedBodyId;
		constraintRow.m_solverBodyIdB = data.m_fixedBodyId;

		btVector3 contactNormalOnB(0,0,0);
#ifndef BTMBP2PCONSTRAINT_BLOCK_ANGULAR_MOTION_TEST
		contactNormalOnB[i] = -1;
#else
		contactNormalOnB[i%3] = -1;
#endif


		 // Convert local points back to world
		btVector3 pivotAworld = m_pivotInA;
		if (m_rigidBodyA)
		{

			constraintRow.m_solverBodyIdA = m_rigidBodyA->getCompanionId();
			pivotAworld = m_rigidBodyA->getCenterOfMassTransform()*m_pivotInA;
		} else
		{
			if (m_bodyA)
				pivotAworld = m_bodyA->localPosToWorld(m_linkA, m_pivotInA);
		}
		btVector3 pivotBworld = m_pivotInB;
		if (m_rigidBodyB)
		{
			constraintRow.m_solverBodyIdB = m_rigidBodyB->getCompanionId();
			pivotBworld = m_rigidBodyB->getCenterOfMassTransform()*m_pivotInB;
		} else
		{
			if (m_bodyB)
				pivotBworld = m_bodyB->localPosToWorld(m_linkB, m_pivotInB);

		}

		btScalar posError = i < 3 ? (pivotAworld-pivotBworld).dot(contactNormalOnB) : 0;

#ifndef BTMBP2PCONSTRAINT_BLOCK_ANGULAR_MOTION_TEST


		fillMultiBodyConstraint(constraintRow, data, 0, 0,
															contactNormalOnB, pivotAworld, pivotBworld,						//sucks but let it be this way "for the time being"
															posError,
															infoGlobal,
															-m_maxAppliedImpulse, m_maxAppliedImpulse
															);
    //@todo: support the case of btMultiBody versus btRigidBody,
    //see btPoint2PointConstraint::getInfo2NonVirtual
#else
		const btVector3 dummy(0, 0, 0);

		btAssert(m_bodyA->isMultiDof());

		btScalar* jac1 = jacobianA(i);
		const btVector3 &normalAng = i >= 3 ? contactNormalOnB : dummy;
		const btVector3 &normalLin = i < 3 ? contactNormalOnB : dummy;

		m_bodyA->filConstraintJacobianMultiDof(m_linkA, pivotAworld, normalAng, normalLin, jac1, data.scratch_r, data.scratch_v, data.scratch_m);

		fillMultiBodyConstraint(constraintRow, data, jac1, 0,
													dummy, dummy, dummy,						//sucks but let it be this way "for the time being"
													posError,
													infoGlobal,
													-m_maxAppliedImpulse, m_maxAppliedImpulse
													);
#endif
	}
}